

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsEquals(JsValueRef object1,JsValueRef object2,bool *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  BOOL BVar2;
  JsrtContext *pJVar3;
  RecyclableObject *pRVar4;
  ScriptContext *__localScriptContext;
  JsErrorCode JVar5;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTEquals
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,object1,object2,false
              );
  }
  JVar5 = JsErrorInvalidArgument;
  if (object1 != (JsValueRef)0x0) {
    if ((ulong)object1 >> 0x30 == 0) {
      pRVar4 = Js::VarTo<Js::RecyclableObject>(object1);
      pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar5 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0037b878;
        object1 = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
      }
    }
    JVar5 = JsErrorInvalidArgument;
    if (object2 != (JsValueRef)0x0) {
      if (object2 < &DAT_1000000000000) {
        pRVar4 = Js::VarTo<Js::RecyclableObject>(object2);
        pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          JVar5 = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_0037b878;
          object2 = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
        }
      }
      if (result == (bool *)0x0) {
        JVar5 = JsErrorNullArgument;
      }
      else {
        BVar2 = Js::JavascriptOperators::Equal(object1,object2,scriptContext);
        *result = BVar2 != 0;
        JVar5 = JsNoError;
      }
    }
  }
LAB_0037b878:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
  if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
    if (*(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)
     ((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar5;
  }
  return JVar5;
}

Assistant:

CHAKRA_API JsEquals(_In_ JsValueRef object1, _In_ JsValueRef object2, _Out_ bool *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTEquals, object1, object2, false);

        VALIDATE_INCOMING_REFERENCE(object1, scriptContext);
        VALIDATE_INCOMING_REFERENCE(object2, scriptContext);
        PARAM_NOT_NULL(result);

        *result = Js::JavascriptOperators::Equal((Js::Var)object1, (Js::Var)object2, scriptContext) != 0;
        return JsNoError;
    });
}